

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metatype_basic.cpp
# Opt level: O1

basic * mpt::metatype::basic::create(char *src,int len)

{
  uint uVar1;
  size_t sVar2;
  basic *this;
  int *piVar3;
  
  if (len < 0) {
    if (src == (char *)0x0) {
      len = 0;
    }
    else {
      sVar2 = strlen(src);
      len = (int)sVar2;
    }
  }
  uVar1 = _mpt_geninfo_size((long)len);
  if ((int)uVar1 < 0) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
  }
  else {
    this = (basic *)malloc((ulong)uVar1 + 8);
    if (this != (basic *)0x0) {
      basic(this,(ulong)uVar1);
      _mpt_geninfo_set(this + 1,src,len);
      return this;
    }
  }
  return (basic *)0x0;
}

Assistant:

metatype::basic *metatype::basic::create(const char *src, int len)
{
	if (len < 0) {
		len = src ? strlen(src) : 0;
	}
	int post;
	if ((post = _mpt_geninfo_size(len)) < 0) {
		errno = EINVAL;
		return 0;
	}
	basic *m;
	void *ptr;
	if (!(ptr = malloc(sizeof(*m) + post))) {
		return 0;
	}
	m = new (ptr) basic(post);
	m->set(src, len);
	return m;
}